

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_tailer.cpp
# Opt level: O3

excerpt_tailer * __thiscall cornelich::excerpt_tailer::to_end(excerpt_tailer *this)

{
  uint uVar1;
  char *__s;
  int __c;
  
  __s = (char *)vanilla_chronicle::last_index(this->m_chronicle);
  if ((long)__s < 0) {
    uVar1 = vanilla_index::find_first_cycle(&this->m_chronicle->m_index);
    if (-1 < (int)uVar1) {
      this->m_index = (ulong)uVar1 * (this->m_chronicle->m_settings).m_entries_per_cycle + -1;
    }
  }
  else {
    index(this,__s,__c);
  }
  return this;
}

Assistant:

excerpt_tailer & excerpt_tailer::to_end()
{
    auto last_index = m_chronicle.last_index();
    if(last_index >= 0)
        index(last_index);
    else
        return to_start();
    return *this;
}